

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O0

uint32_t __thiscall
asmjit::v1_14::RALocalAllocator::decideOnSpillFor
          (RALocalAllocator *this,RegGroup group,uint32_t workId,RegMask spillableRegs,
          uint32_t *spillWorkId)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint workId_00;
  uint32_t assignedId;
  uint32_t uVar3;
  int in_ECX;
  RAAssignment *in_RDI;
  uint32_t *in_R8;
  uint32_t localCost;
  uint32_t localWorkId;
  uint32_t localPhysId;
  uint32_t bestCost;
  uint32_t bestWorkId;
  uint32_t bestPhysId;
  BitWordIterator<unsigned_int> it;
  char *in_stack_00000380;
  int in_stack_0000038c;
  char *in_stack_00000390;
  uint32_t in_stack_ffffffffffffff88;
  RegGroup in_stack_ffffffffffffff8f;
  undefined4 in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffff9c;
  uint32_t in_stack_ffffffffffffffa4;
  uint32_t in_stack_ffffffffffffffa8;
  undefined1 local_38 [24];
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_8 = local_38;
  if (in_ECX != 0) {
    local_20 = &stack0xffffffffffffffb4;
    uVar1 = Support::BitWordIterator<unsigned_int>::next
                      ((BitWordIterator<unsigned_int> *)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    uVar2 = RAAssignment::physToWorkId(in_RDI,in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88);
    local_10 = &stack0xffffffffffffffb4;
    if (in_ECX != 0) {
      workId_00 = calculateSpillCost((RALocalAllocator *)CONCAT44(in_ECX,uVar1),
                                     (RegGroup)(uVar2 >> 0x18),in_stack_ffffffffffffffa8,
                                     in_stack_ffffffffffffffa4);
      do {
        assignedId = Support::BitWordIterator<unsigned_int>::next
                               ((BitWordIterator<unsigned_int> *)
                                CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        uVar3 = RAAssignment::physToWorkId
                          (in_RDI,in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88);
        in_stack_ffffffffffffff9c =
             calculateSpillCost((RALocalAllocator *)CONCAT44(in_ECX,uVar1),(RegGroup)(uVar2 >> 0x18)
                                ,workId_00,assignedId);
        if (in_stack_ffffffffffffff9c < workId_00) {
          workId_00 = in_stack_ffffffffffffff9c;
          uVar2 = uVar3;
          uVar1 = assignedId;
        }
        local_18 = &stack0xffffffffffffffb4;
      } while (in_ECX != 0);
    }
    *in_R8 = uVar2;
    return uVar1;
  }
  DebugUtils::assertionFailed(in_stack_00000390,in_stack_0000038c,in_stack_00000380);
}

Assistant:

uint32_t RALocalAllocator::decideOnSpillFor(RegGroup group, uint32_t workId, RegMask spillableRegs, uint32_t* spillWorkId) const noexcept {
  // May be used in the future to decide which register would be best to spill so `workId` can be assigned.
  DebugUtils::unused(workId);
  ASMJIT_ASSERT(spillableRegs != 0);

  Support::BitWordIterator<RegMask> it(spillableRegs);
  uint32_t bestPhysId = it.next();
  uint32_t bestWorkId = _curAssignment.physToWorkId(group, bestPhysId);

  // Avoid calculating the cost model if there is only one spillable register.
  if (it.hasNext()) {
    uint32_t bestCost = calculateSpillCost(group, bestWorkId, bestPhysId);
    do {
      uint32_t localPhysId = it.next();
      uint32_t localWorkId = _curAssignment.physToWorkId(group, localPhysId);
      uint32_t localCost = calculateSpillCost(group, localWorkId, localPhysId);

      if (localCost < bestCost) {
        bestCost = localCost;
        bestPhysId = localPhysId;
        bestWorkId = localWorkId;
      }
    } while (it.hasNext());
  }

  *spillWorkId = bestWorkId;
  return bestPhysId;
}